

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall
ON_PlaneSurface::GetBBox(ON_PlaneSurface *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  long lVar2;
  ON_3dPoint local_b0;
  double local_98;
  ON_3dPoint corner [4];
  int local_30;
  int local_2c;
  int k;
  int j;
  int i;
  bool bGrowBox_local;
  double *boxmax_local;
  double *boxmin_local;
  ON_PlaneSurface *this_local;
  
  local_30 = 0;
  for (k = 0; k < 2; k = k + 1) {
    for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
      ON_Surface::PointAt(&local_b0,&this->super_ON_Surface,
                          *(double *)(&this->field_0x90 + (long)k * 8),
                          *(double *)(&this->field_0xa0 + (long)local_2c * 8));
      lVar2 = (long)local_30;
      corner[lVar2 + -1].z = local_b0.x;
      corner[lVar2].x = local_b0.y;
      corner[lVar2].y = local_b0.z;
      local_30 = local_30 + 1;
    }
  }
  bVar1 = ON_GetPointListBoundingBox(3,false,4,3,&local_98,boxmin,boxmax,(uint)(-bGrowBox & 1));
  return bVar1;
}

Assistant:

bool ON_PlaneSurface::GetBBox( // returns true if successful
         double* boxmin,    // minimum
         double* boxmax,    // maximum
         bool bGrowBox
         ) const
{
  int i,j,k=0;
  ON_3dPoint corner[4];
  for ( i = 0; i < 2; i++ ) for ( j = 0; j < 2; j++ ) {
    corner[k++] = PointAt( m_domain[0].m_t[i], m_domain[1].m_t[j] );
  }
  return ON_GetPointListBoundingBox( 3, 0, 4, 3, 
                                     &corner[0].x, 
                                     boxmin, 
                                     boxmax, bGrowBox?true:false );
}